

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

string * __thiscall
cmNinjaTargetGenerator::GetPreprocessedFilePath_abi_cxx11_
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,cmSourceFile *source)

{
  bool bVar1;
  string *psVar2;
  cmGlobalNinjaGenerator *this_00;
  ulong uVar3;
  ulong uVar4;
  string local_128 [39];
  undefined1 local_101;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  undefined1 local_c0 [8];
  string ppName;
  string *objExt;
  string *objName;
  undefined1 local_40 [8];
  string ppExt;
  cmSourceFile *source_local;
  cmNinjaTargetGenerator *this_local;
  string *path;
  
  ppExt.field_2._8_8_ = source;
  psVar2 = cmSourceFile::GetExtension_abi_cxx11_(source);
  std::__cxx11::string::string((string *)local_40,(string *)psVar2);
  bVar1 = cmHasLiteralPrefix<std::__cxx11::string,2ul>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                     (char (*) [2])0xa2dd9e);
  if (bVar1) {
    cmsys::SystemTools::LowerCase((string *)&objName,(string *)local_40);
    std::__cxx11::string::operator=((string *)local_40,(string *)&objName);
    std::__cxx11::string::~string((string *)&objName);
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_40,"fpp");
  if (bVar1) {
    std::__cxx11::string::operator=((string *)local_40,"f");
  }
  psVar2 = cmGeneratorTarget::GetObjectName_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).GeneratorTarget,
                      (cmSourceFile *)ppExt.field_2._8_8_);
  this_00 = GetGlobalGenerator(this);
  cmGlobalGenerator::GetLanguageOutputExtension_abi_cxx11_
            ((string *)((long)&ppName.field_2 + 8),(cmGlobalGenerator *)this_00,
             (cmSourceFile *)ppExt.field_2._8_8_);
  uVar3 = std::__cxx11::string::size();
  uVar4 = std::__cxx11::string::size();
  if (uVar4 <= uVar3) {
    std::__cxx11::string::size();
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)&local_100,(ulong)psVar2);
    std::operator+(&local_e0,&local_100,"-pp.");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
                   &local_e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    local_101 = 0;
    cmLocalNinjaGenerator::GetHomeRelativeOutputPath_abi_cxx11_
              (__return_storage_ptr__,this->LocalGenerator);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/");
    }
    (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
      _vptr_cmLocalGenerator[0xc])
              (local_128,this->LocalGenerator,(this->super_cmCommonTargetGenerator).GeneratorTarget)
    ;
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_128);
    std::__cxx11::string::~string(local_128);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_c0);
    local_101 = 1;
    std::__cxx11::string::~string((string *)local_c0);
    std::__cxx11::string::~string((string *)(ppName.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_40);
    return __return_storage_ptr__;
  }
  __assert_fail("objName.size() >= objExt.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmNinjaTargetGenerator.cxx"
                ,0x11f,
                "std::string cmNinjaTargetGenerator::GetPreprocessedFilePath(const cmSourceFile *) const"
               );
}

Assistant:

std::string cmNinjaTargetGenerator::GetPreprocessedFilePath(
  cmSourceFile const* source) const
{
  // Choose an extension to compile already-preprocessed source.
  std::string ppExt = source->GetExtension();
  if (cmHasLiteralPrefix(ppExt, "F")) {
    // Some Fortran compilers automatically enable preprocessing for
    // upper-case extensions.  Since the source is already preprocessed,
    // use a lower-case extension.
    ppExt = cmSystemTools::LowerCase(ppExt);
  }
  if (ppExt == "fpp") {
    // Some Fortran compilers automatically enable preprocessing for
    // the ".fpp" extension.  Since the source is already preprocessed,
    // use the ".f" extension.
    ppExt = "f";
  }

  // Take the object file name and replace the extension.
  std::string const& objName = this->GeneratorTarget->GetObjectName(source);
  std::string const& objExt =
    this->GetGlobalGenerator()->GetLanguageOutputExtension(*source);
  assert(objName.size() >= objExt.size());
  std::string const ppName =
    objName.substr(0, objName.size() - objExt.size()) + "-pp." + ppExt;

  std::string path = this->LocalGenerator->GetHomeRelativeOutputPath();
  if (!path.empty()) {
    path += "/";
  }
  path += this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget);
  path += "/";
  path += ppName;
  return path;
}